

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_realpath(void)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  size_t sVar4;
  undefined1 *unaff_RBX;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  char *pcVar7;
  int iVar8;
  uv_loop_t *__s;
  uv_buf_t uVar9;
  uv_fs_t req;
  long alStack_de8 [3];
  undefined1 auStack_dd0 [440];
  uv_loop_t *puStack_c18;
  undefined8 uStack_be0;
  char acStack_bd8 [7];
  undefined4 auStack_bd1 [256];
  uv_loop_t *puStack_7d0;
  uv_loop_t *puStack_7c8;
  uv_loop_t *puStack_7c0;
  code *pcStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a0;
  uv_loop_t uStack_798;
  undefined1 *puStack_1d8;
  undefined1 local_1c0 [88];
  long local_168;
  long local_160;
  
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_realpath(loop,local_1c0,"no_such_file",dummy_cb);
  if (iVar2 == 0) {
    iVar2 = uv_run(loop,0);
    if (iVar2 != 0) goto LAB_00155f5f;
    if (dummy_cb_count != 1) goto LAB_00155f64;
    if (local_160 != 0) goto LAB_00155f69;
    if (local_168 != -2) goto LAB_00155f6e;
    unaff_RBX = local_1c0;
    uv_fs_req_cleanup(unaff_RBX);
    iVar2 = uv_fs_realpath(0,unaff_RBX,"no_such_file",0);
    if (iVar2 != -2) goto LAB_00155f73;
    if (local_160 != 0) goto LAB_00155f78;
    if (local_168 != -2) goto LAB_00155f7d;
    uv_fs_req_cleanup(local_1c0);
    unaff_RBX = (undefined1 *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar3 = uv_default_loop();
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_realpath_cold_1();
LAB_00155f5f:
    run_test_fs_realpath_cold_2();
LAB_00155f64:
    run_test_fs_realpath_cold_3();
LAB_00155f69:
    run_test_fs_realpath_cold_4();
LAB_00155f6e:
    run_test_fs_realpath_cold_5();
LAB_00155f73:
    run_test_fs_realpath_cold_6();
LAB_00155f78:
    run_test_fs_realpath_cold_7();
LAB_00155f7d:
    run_test_fs_realpath_cold_8();
  }
  run_test_fs_realpath_cold_9();
  puVar5 = (uv_loop_t *)0x184395;
  pcStack_7b8 = (code *)0x155fa0;
  puStack_1d8 = unaff_RBX;
  unlink("test_file");
  pcStack_7b8 = (code *)0x155fac;
  unlink("test_file_symlink");
  pcStack_7b8 = (code *)0x155fb8;
  unlink("test_file_symlink2");
  pcStack_7b8 = (code *)0x155fc4;
  unlink("test_file_symlink_symlink");
  pcStack_7b8 = (code *)0x155fd0;
  unlink("test_file_symlink2_symlink");
  uStack_7a0 = 0x400;
  __s = (uv_loop_t *)(uStack_798.async_handles + 1);
  pcStack_7b8 = (code *)0x155fec;
  uv_cwd(__s);
  pcStack_7b8 = (code *)0x155ff4;
  sVar4 = strlen((char *)__s);
  *(undefined8 *)((long)uStack_798.async_handles + sVar4 + 8) = 0x69665f747365742f;
  *(undefined4 *)((long)uStack_798.async_handles + sVar4 + 0xf) = 0x656c69;
  pcStack_7b8 = (code *)0x156016;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar7 = (char *)0x0;
  pcStack_7b8 = (code *)0x15603a;
  iVar2 = uv_fs_open(0,&uStack_798,"test_file",0x42,0x180,0);
  pvVar1 = uStack_798.watcher_queue[0];
  if (iVar2 < 0) {
    pcStack_7b8 = (code *)0x156517;
    run_test_fs_symlink_cold_1();
LAB_00156517:
    pcStack_7b8 = (code *)0x15651c;
    run_test_fs_symlink_cold_2();
LAB_0015651c:
    pcStack_7b8 = (code *)0x156521;
    run_test_fs_symlink_cold_3();
LAB_00156521:
    pcStack_7b8 = (code *)0x156526;
    run_test_fs_symlink_cold_4();
LAB_00156526:
    pcStack_7b8 = (code *)0x15652b;
    run_test_fs_symlink_cold_5();
LAB_0015652b:
    pcStack_7b8 = (code *)0x156530;
    run_test_fs_symlink_cold_6();
LAB_00156530:
    puVar6 = puVar5;
    pcStack_7b8 = (code *)0x156535;
    run_test_fs_symlink_cold_7();
LAB_00156535:
    pcStack_7b8 = (code *)0x15653a;
    run_test_fs_symlink_cold_8();
LAB_0015653a:
    pcStack_7b8 = (code *)0x15653f;
    run_test_fs_symlink_cold_9();
LAB_0015653f:
    pcStack_7b8 = (code *)0x156544;
    run_test_fs_symlink_cold_10();
LAB_00156544:
    pcStack_7b8 = (code *)0x156549;
    run_test_fs_symlink_cold_11();
LAB_00156549:
    pcStack_7b8 = (code *)0x15654e;
    run_test_fs_symlink_cold_12();
LAB_0015654e:
    pcStack_7b8 = (code *)0x156553;
    run_test_fs_symlink_cold_13();
LAB_00156553:
    pcStack_7b8 = (code *)0x156558;
    run_test_fs_symlink_cold_14();
LAB_00156558:
    pcStack_7b8 = (code *)0x15655d;
    run_test_fs_symlink_cold_15();
LAB_0015655d:
    pcStack_7b8 = (code *)0x156562;
    run_test_fs_symlink_cold_16();
LAB_00156562:
    pcStack_7b8 = (code *)0x156567;
    run_test_fs_symlink_cold_17();
LAB_00156567:
    pcStack_7b8 = (code *)0x15656c;
    run_test_fs_symlink_cold_18();
LAB_0015656c:
    puVar5 = puVar6;
    pcStack_7b8 = (code *)0x156571;
    run_test_fs_symlink_cold_19();
LAB_00156571:
    pcStack_7b8 = (code *)0x156576;
    run_test_fs_symlink_cold_20();
LAB_00156576:
    pcStack_7b8 = (code *)0x15657b;
    run_test_fs_symlink_cold_21();
LAB_0015657b:
    pcStack_7b8 = (code *)0x156580;
    run_test_fs_symlink_cold_22();
LAB_00156580:
    pcStack_7b8 = (code *)0x156585;
    run_test_fs_symlink_cold_23();
LAB_00156585:
    pcStack_7b8 = (code *)0x15658a;
    run_test_fs_symlink_cold_24();
LAB_0015658a:
    pcStack_7b8 = (code *)0x15658f;
    run_test_fs_symlink_cold_25();
LAB_0015658f:
    pcStack_7b8 = (code *)0x156594;
    run_test_fs_symlink_cold_26();
LAB_00156594:
    pcStack_7b8 = (code *)0x156599;
    run_test_fs_symlink_cold_27();
LAB_00156599:
    pcStack_7b8 = (code *)0x15659e;
    run_test_fs_symlink_cold_28();
  }
  else {
    puVar5 = (uv_loop_t *)uStack_798.watcher_queue[0];
    if ((long)uStack_798.watcher_queue[0] < 0) goto LAB_00156517;
    __s = &uStack_798;
    pcStack_7b8 = (code *)0x15605d;
    uv_fs_req_cleanup(__s);
    pcStack_7b8 = (code *)0x15606e;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_7b0 = 0;
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x1560a4;
    iVar2 = uv_fs_write(0,__s,(ulong)pvVar1 & 0xffffffff,&iov,1,0xffffffffffffffff);
    puVar5 = (uv_loop_t *)pvVar1;
    if (iVar2 != 0xd) goto LAB_0015651c;
    if ((uv_loop_t *)uStack_798.watcher_queue[0] != (uv_loop_t *)0xd) goto LAB_00156521;
    __s = &uStack_798;
    pcStack_7b8 = (code *)0x1560c6;
    uv_fs_req_cleanup(__s);
    pcStack_7b8 = (code *)0x1560d9;
    uv_fs_close(loop,__s,(ulong)pvVar1 & 0xffffffff,0);
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x1560f7;
    iVar2 = uv_fs_symlink(0,__s,"test_file","test_file_symlink",0,0);
    if (iVar2 != 0) goto LAB_00156526;
    if ((uv_loop_t *)uStack_798.watcher_queue[0] != (uv_loop_t *)0x0) goto LAB_0015652b;
    pcStack_7b8 = (code *)0x156118;
    uv_fs_req_cleanup();
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x156134;
    iVar2 = uv_fs_open(0,&uStack_798,"test_file_symlink",2,0,0);
    puVar6 = (uv_loop_t *)uStack_798.watcher_queue[0];
    puVar5 = &uStack_798;
    if (iVar2 < 0) goto LAB_00156530;
    if ((long)uStack_798.watcher_queue[0] < 0) goto LAB_00156535;
    __s = &uStack_798;
    pcStack_7b8 = (code *)0x156157;
    uv_fs_req_cleanup(__s);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_7b8 = (code *)0x156179;
    uVar9 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_7b0 = 0;
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x1561ab;
    iov = uVar9;
    iVar2 = uv_fs_read(0,__s,(ulong)puVar6 & 0xffffffff,&iov,1,0);
    if (iVar2 < 0) goto LAB_0015653a;
    if ((long)uStack_798.watcher_queue[0] < 0) goto LAB_0015653f;
    pcVar7 = buf;
    pcStack_7b8 = (code *)0x1561d2;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00156544;
    __s = &uStack_798;
    pcStack_7b8 = (code *)0x1561f2;
    uv_fs_close(loop,__s,(ulong)puVar6 & 0xffffffff,0);
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x156210;
    iVar2 = uv_fs_symlink(0,__s,"test_file_symlink","test_file_symlink_symlink",0,0);
    if (iVar2 != 0) goto LAB_00156549;
    puVar6 = &uStack_798;
    pcStack_7b8 = (code *)0x156225;
    uv_fs_req_cleanup();
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x156238;
    iVar2 = uv_fs_readlink(0,puVar6,"test_file_symlink_symlink",0);
    if (iVar2 != 0) goto LAB_0015654e;
    pcStack_7b8 = (code *)0x156251;
    pcVar7 = (char *)uStack_798.watcher_queue[1];
    iVar2 = strcmp((char *)uStack_798.watcher_queue[1],"test_file_symlink");
    if (iVar2 != 0) goto LAB_00156553;
    puVar6 = &uStack_798;
    pcStack_7b8 = (code *)0x156266;
    uv_fs_req_cleanup();
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x156279;
    iVar2 = uv_fs_realpath(0,puVar6,"test_file_symlink_symlink",0);
    if (iVar2 != 0) goto LAB_00156558;
    pcStack_7b8 = (code *)0x156293;
    iVar2 = strcmp((char *)uStack_798.watcher_queue[1],(char *)(uStack_798.async_handles + 1));
    pcVar7 = (char *)uStack_798.watcher_queue[1];
    if (iVar2 != 0) goto LAB_0015655d;
    puVar6 = &uStack_798;
    pcStack_7b8 = (code *)0x1562a8;
    uv_fs_req_cleanup(puVar6);
    pcStack_7b8 = (code *)0x1562cf;
    pcVar7 = (char *)loop;
    iVar2 = uv_fs_symlink(loop,puVar6,"test_file","test_file_symlink2",0,symlink_cb);
    if (iVar2 != 0) goto LAB_00156562;
    pcStack_7b8 = (code *)0x1562e5;
    pcVar7 = (char *)loop;
    uv_run(loop,0);
    if (symlink_cb_count != 1) goto LAB_00156567;
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x156310;
    iVar2 = uv_fs_open(0,&uStack_798,"test_file_symlink2",2,0,0);
    puVar5 = (uv_loop_t *)uStack_798.watcher_queue[0];
    if (iVar2 < 0) goto LAB_0015656c;
    if ((long)uStack_798.watcher_queue[0] < 0) goto LAB_00156571;
    __s = &uStack_798;
    pcStack_7b8 = (code *)0x156333;
    uv_fs_req_cleanup(__s);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_7b8 = (code *)0x156355;
    uVar9 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_7b0 = 0;
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x156387;
    iov = uVar9;
    iVar2 = uv_fs_read(0,__s,(ulong)puVar5 & 0xffffffff,&iov,1,0);
    if (iVar2 < 0) goto LAB_00156576;
    if ((long)uStack_798.watcher_queue[0] < 0) goto LAB_0015657b;
    pcVar7 = buf;
    pcStack_7b8 = (code *)0x1563ae;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00156580;
    __s = &uStack_798;
    pcStack_7b8 = (code *)0x1563ce;
    uv_fs_close(loop,__s,(ulong)puVar5 & 0xffffffff,0);
    pcVar7 = (char *)0x0;
    pcStack_7b8 = (code *)0x1563ec;
    iVar2 = uv_fs_symlink(0,__s,"test_file_symlink2","test_file_symlink2_symlink",0,0);
    if (iVar2 != 0) goto LAB_00156585;
    puVar5 = &uStack_798;
    pcStack_7b8 = (code *)0x156401;
    uv_fs_req_cleanup(puVar5);
    pcStack_7b8 = (code *)0x15641e;
    pcVar7 = (char *)loop;
    iVar2 = uv_fs_readlink(loop,puVar5,"test_file_symlink2_symlink",readlink_cb);
    if (iVar2 != 0) goto LAB_0015658a;
    pcStack_7b8 = (code *)0x156434;
    pcVar7 = (char *)loop;
    uv_run(loop,0);
    if (readlink_cb_count != 1) goto LAB_0015658f;
    pcStack_7b8 = (code *)0x156460;
    pcVar7 = (char *)loop;
    iVar2 = uv_fs_realpath(loop,&uStack_798,"test_file",realpath_cb);
    if (iVar2 != 0) goto LAB_00156594;
    pcStack_7b8 = (code *)0x156476;
    pcVar7 = (char *)loop;
    uv_run(loop,0);
    if (realpath_cb_count != 1) goto LAB_00156599;
    pcStack_7b8 = (code *)0x156491;
    uv_run(loop,0);
    pcStack_7b8 = (code *)0x15649d;
    unlink("test_file");
    pcStack_7b8 = (code *)0x1564a9;
    unlink("test_file_symlink");
    pcStack_7b8 = (code *)0x1564b5;
    unlink("test_file_symlink_symlink");
    pcStack_7b8 = (code *)0x1564c1;
    unlink("test_file_symlink2");
    pcStack_7b8 = (code *)0x1564cd;
    unlink("test_file_symlink2_symlink");
    pcStack_7b8 = (code *)0x1564d2;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_7b8 = (code *)0x1564e6;
    uv_walk(puVar5,close_walk_cb,0);
    pcStack_7b8 = (code *)0x1564f0;
    uv_run(puVar5,0);
    pcStack_7b8 = (code *)0x1564f5;
    pcVar7 = (char *)uv_default_loop();
    pcStack_7b8 = (code *)0x1564fd;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStack_7b8 = symlink_cb;
  run_test_fs_symlink_cold_29();
  if (((uv_loop_t *)pcVar7)->backend_fd == 0x18) {
    if (((uv_loop_t *)pcVar7)->watcher_queue[0] == (void *)0x0) {
      symlink_cb_count = symlink_cb_count + 1;
      iVar2 = uv_fs_req_cleanup();
      return iVar2;
    }
  }
  else {
    puStack_7c0 = (uv_loop_t *)0x1565c2;
    symlink_cb_cold_1();
  }
  puStack_7c0 = (uv_loop_t *)readlink_cb;
  symlink_cb_cold_2();
  puVar6 = (uv_loop_t *)pcVar7;
  puStack_7c0 = puVar5;
  if (((uv_loop_t *)pcVar7)->backend_fd == 0x19) {
    if (((uv_loop_t *)pcVar7)->watcher_queue[0] != (void *)0x0) goto LAB_00156600;
    puVar6 = (uv_loop_t *)((uv_loop_t *)pcVar7)->watcher_queue[1];
    puStack_7c8 = (uv_loop_t *)0x1565e8;
    iVar2 = strcmp((char *)puVar6,"test_file_symlink2");
    if (iVar2 == 0) {
      readlink_cb_count = readlink_cb_count + 1;
      iVar2 = uv_fs_req_cleanup(pcVar7);
      return iVar2;
    }
  }
  else {
    puStack_7c8 = (uv_loop_t *)0x156600;
    readlink_cb_cold_1();
    pcVar7 = (char *)puVar5;
LAB_00156600:
    puStack_7c8 = (uv_loop_t *)0x156605;
    readlink_cb_cold_2();
  }
  puStack_7c8 = (uv_loop_t *)realpath_cb;
  readlink_cb_cold_3();
  uStack_be0 = 0x400;
  puVar5 = puVar6;
  puStack_7d0 = (uv_loop_t *)pcVar7;
  puStack_7c8 = __s;
  if (puVar6->backend_fd == 0x1c) {
    if (puVar6->watcher_queue[0] == (void *)0x0) {
      uv_cwd(acStack_bd8,&uStack_be0);
      sVar4 = strlen(acStack_bd8);
      builtin_strncpy(acStack_bd8 + sVar4,"/test_fi",8);
      *(undefined4 *)((long)auStack_bd1 + sVar4) = 0x656c69;
      puVar5 = (uv_loop_t *)puVar6->watcher_queue[1];
      iVar2 = strcmp((char *)puVar5,acStack_bd8);
      if (iVar2 == 0) {
        realpath_cb_count = realpath_cb_count + 1;
        iVar2 = uv_fs_req_cleanup(puVar6);
        return iVar2;
      }
      goto LAB_00156691;
    }
  }
  else {
    realpath_cb_cold_1();
    puVar6 = (uv_loop_t *)pcVar7;
  }
  realpath_cb_cold_2();
LAB_00156691:
  realpath_cb_cold_3();
  puStack_c18 = puVar6;
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");
  alStack_de8[0] = 0x400;
  loop = (uv_loop_t *)uv_default_loop();
  iVar8 = 0;
  uv_fs_mkdir(0,auStack_dd0,"test_dir",0x1ff,0);
  uv_fs_req_cleanup(auStack_dd0);
  uv_cwd(test_symlink_dir_impl::test_dir_abs_buf,alStack_de8);
  sVar4 = strlen(test_symlink_dir_impl::test_dir_abs_buf);
  builtin_strncpy(test_symlink_dir_impl::test_dir_abs_buf + sVar4,"/test_di",8);
  (test_symlink_dir_impl::test_dir_abs_buf + sVar4 + 8)[0] = 'r';
  (test_symlink_dir_impl::test_dir_abs_buf + sVar4 + 8)[1] = '\0';
  alStack_de8[0] = alStack_de8[0] + 9;
  iVar2 = uv_fs_symlink(0,auStack_dd0,"test_dir","test_dir_symlink",(ulong)puVar5 & 0xffffffff,0);
  if (((int)puVar5 == 1) && ((iVar2 == -1 || (iVar2 == -0x5f)))) {
    test_symlink_dir_impl_cold_1();
    iVar8 = 1;
  }
  else {
    test_symlink_dir_impl_cold_2();
  }
  return iVar8;
}

Assistant:

TEST_IMPL(fs_realpath) {
  uv_fs_t req;

  loop = uv_default_loop();
  ASSERT(0 == uv_fs_realpath(loop, &req, "no_such_file", dummy_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(dummy_cb_count == 1);
  ASSERT(req.ptr == NULL);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support GetFinalPathNameByHandleW()
   */
  if (req.result == UV_ENOSYS) {
    uv_fs_req_cleanup(&req);
    RETURN_SKIP("realpath is not supported on Windows XP");
  }
#endif
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  ASSERT(UV_ENOENT == uv_fs_realpath(NULL, &req, "no_such_file", NULL));
  ASSERT(req.ptr == NULL);
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY();
  return 0;
}